

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<long_double>_>::PrepareZ
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *y,
          TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *beta,int opt)

{
  Fad<long_double> *this_00;
  Fad<long_double> *pFVar1;
  double *in_RCX;
  TPZFMatrix<Fad<long_double>_> *in_RDX;
  TPZFMatrix<Fad<long_double>_> *in_RSI;
  TPZFMatrix<Fad<long_double>_> *in_RDI;
  int in_R8D;
  int64_t i;
  Fad<long_double> *yp;
  Fad<long_double> *zlast;
  Fad<long_double> *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  undefined7 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2f;
  long local_b0;
  Fad<long_double> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar2;
  Fad<long_double> local_88;
  Fad<long_double> *local_50;
  Fad<long_double> *local_48;
  long local_40;
  int64_t local_38;
  Fad<long_double> *local_30;
  TPZFMatrix<Fad<long_double>_> *local_18;
  TPZFMatrix<Fad<long_double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_R8D == 0) {
    this_00 = (Fad<long_double> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  }
  else {
    this_00 = (Fad<long_double> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  }
  local_30 = this_00;
  local_38 = TPZBaseMatrix::Cols((TPZBaseMatrix *)local_10);
  (*(local_18->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local_18,local_30,local_38);
  for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
    local_48 = TPZFMatrix<Fad<long_double>_>::operator()(in_RDI,(int64_t)in_RCX,(int64_t)this_00);
    local_50 = local_48 + (long)local_30;
    uVar2 = 0;
    pFVar1 = &local_88;
    Fad<long_double>::Fad<int,_nullptr>
              (this_00,(int *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    in_stack_ffffffffffffff2f =
         ::operator!=(this_00,(Fad<long_double> *)
                              CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    Fad<long_double>::~Fad(pFVar1);
    if ((in_stack_ffffffffffffff2f & 1) == 0) {
      for (; local_48 != local_50; local_48 = local_48 + 1) {
        Fad<long_double>::operator=<double,_nullptr>((Fad<long_double> *)in_RDI,in_RCX);
      }
    }
    else {
      pFVar1 = TPZFMatrix<Fad<long_double>_>::g(local_10,0,local_40);
      if (local_18 != local_10) {
        memcpy(local_48,pFVar1,(long)local_30 * 0x30);
      }
      for (local_b0 = 0; local_b0 < (long)local_30; local_b0 = local_b0 + 1) {
        TPZFMatrix<Fad<long_double>_>::operator()(in_RDI,(int64_t)in_RCX,(int64_t)this_00);
        Fad<long_double>::operator*=<long_double,_nullptr>
                  ((Fad<long_double> *)CONCAT44(uVar2,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}